

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyGetSet
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue getter,JSValue setter,int flags)

{
  JSValue v;
  JSValue v_00;
  int iVar1;
  JSContext *in_R9;
  JSValueUnion in_stack_00000008;
  int64_t in_stack_00000010;
  int ret;
  JSAtom in_stack_0000018c;
  JSContext *in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  undefined1 in_stack_000001a8 [16];
  JSValue in_stack_000002c0;
  JSValue in_stack_000002d0;
  int in_stack_000002e0;
  
  iVar1 = JS_DefineProperty(in_stack_00000190,(JSValue)in_stack_000001a8,in_stack_0000018c,
                            (JSValue)in_stack_00000198,in_stack_000002c0,in_stack_000002d0,
                            in_stack_000002e0);
  v.tag = in_stack_00000010;
  v.u.ptr = in_stack_00000008.ptr;
  JS_FreeValue(in_R9,v);
  v_00.tag = in_stack_00000010;
  v_00.u.ptr = in_stack_00000008.ptr;
  JS_FreeValue(in_R9,v_00);
  return iVar1;
}

Assistant:

int JS_DefinePropertyGetSet(JSContext *ctx, JSValueConst this_obj,
                            JSAtom prop, JSValue getter, JSValue setter,
                            int flags)
{
    int ret;
    ret = JS_DefineProperty(ctx, this_obj, prop, JS_UNDEFINED, getter, setter,
                            flags | JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                            JS_PROP_HAS_CONFIGURABLE | JS_PROP_HAS_ENUMERABLE);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return ret;
}